

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<int>>::
     call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
               (QPromise<int> *promise,QPromiseResolve<int> *resolve,QPromiseReject<int> *reject)

{
  QPromiseReject<int> *pQVar1;
  QPromiseResolve<int> *fulfilled;
  bool bVar2;
  PromiseValue<int> *value;
  PromiseData<int> *pPVar3;
  PromiseError *error;
  QPromiseReject<int> local_70;
  QPromise<int> local_68 [2];
  anon_class_24_2_d74e9aa7 local_48;
  QPromiseBase<int> local_30;
  QPromiseReject<int> *local_20;
  QPromiseReject<int> *reject_local;
  QPromiseResolve<int> *resolve_local;
  QPromise<int> *promise_local;
  
  local_20 = reject;
  reject_local = (QPromiseReject<int> *)resolve;
  resolve_local = (QPromiseResolve<int> *)promise;
  bVar2 = QtPromise::QPromiseBase<int>::isFulfilled(&promise->super_QPromiseBase<int>);
  pQVar1 = reject_local;
  if (bVar2) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_>::operator->
                       ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *)
                        (resolve_local + 1));
    value = PromiseData<int>::value(pPVar3);
    QtPromise::QPromiseResolve<int>::operator()((QPromiseResolve<int> *)pQVar1,value);
  }
  else {
    bVar2 = QtPromise::QPromiseBase<int>::isRejected((QPromiseBase<int> *)resolve_local);
    fulfilled = resolve_local;
    pQVar1 = local_20;
    if (bVar2) {
      pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_>::operator->
                         ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *)
                          (resolve_local + 1));
      error = PromiseDataBase<int,_void_(const_int_&)>::error
                        (&pPVar3->super_PromiseDataBase<int,_void_(const_int_&)>);
      QtPromise::QPromiseReject<int>::operator()(pQVar1,error);
    }
    else {
      QtPromise::QPromiseResolve<int>::QPromiseResolve
                ((QPromiseResolve<int> *)&local_48,(QPromiseResolve<int> *)reject_local);
      QtPromise::QPromise<int>::QPromise(&local_48.promise,(QPromise<int> *)resolve_local);
      QtPromise::QPromiseReject<int>::QPromiseReject(&local_70,local_20);
      QtPromise::QPromise<int>::QPromise(local_68,(QPromise<int> *)resolve_local);
      QtPromise::QPromiseBase<int>::
      then<QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<int>>::call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromise<int>const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)::_lambda()_1_,QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<int>>::call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromise<int>const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)::_lambda()_2_>
                (&local_30,(anon_class_24_2_e6a34898 *)fulfilled,&local_48);
      QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_30);
      call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromise<int>const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
      ::{lambda()#2}::~call((_lambda___2_ *)&local_70);
      call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromise<int>const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
      ::{lambda()#1}::~call((_lambda___1_ *)&local_48);
    }
  }
  return;
}

Assistant:

static void
    call(const QtPromise::QPromise<T>& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve(promise.m_d->value());
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve(promise.m_d->value());
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }